

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O1

WindowSurfacePair
eglu::anon_unknown_1::createWindow
          (NativeDisplay *nativeDisplay,NativeWindowFactory *windowFactory,EGLDisplay eglDisplay,
          EGLConfig eglConfig,RenderConfig *config)

{
  int iVar1;
  undefined4 extraout_var;
  EGLSurface pvVar2;
  WindowSurfacePair WVar3;
  EGLAttrib attribList [1];
  EGLAttrib local_40;
  undefined8 local_34;
  Visibility local_2c;
  
  local_34._0_4_ = config->width;
  local_34._4_4_ = config->height;
  local_2c = VISIBILITY_LAST;
  if (config->windowVisibility < VISIBILITY_LAST) {
    local_2c = config->windowVisibility;
  }
  local_40 = 0x3038;
  iVar1 = (*(windowFactory->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (windowFactory,nativeDisplay,eglDisplay,eglConfig,&local_40);
  WVar3.first = (NativeWindow *)CONCAT44(extraout_var,iVar1);
  pvVar2 = createWindowSurface(nativeDisplay,WVar3.first,eglDisplay,eglConfig,&local_40);
  WVar3.second = pvVar2;
  return WVar3;
}

Assistant:

WindowSurfacePair createWindow (NativeDisplay* nativeDisplay, const NativeWindowFactory* windowFactory, EGLDisplay eglDisplay, EGLConfig eglConfig, const glu::RenderConfig& config)
{
	const int						width			= (config.width		== glu::RenderConfig::DONT_CARE ? WindowParams::SIZE_DONT_CARE	: config.width);
	const int						height			= (config.height	== glu::RenderConfig::DONT_CARE ? WindowParams::SIZE_DONT_CARE	: config.height);
	const WindowParams::Visibility	visibility		= getNativeWindowVisibility(config.windowVisibility);
	NativeWindow*					nativeWindow	= DE_NULL;
	EGLSurface						surface			= EGL_NO_SURFACE;
	const EGLAttrib					attribList[]	= { EGL_NONE };

	nativeWindow = windowFactory->createWindow(nativeDisplay, eglDisplay, eglConfig, &attribList[0], WindowParams(width, height, visibility));

	try
	{
		surface = eglu::createWindowSurface(*nativeDisplay, *nativeWindow, eglDisplay, eglConfig, attribList);
	}
	catch (...)
	{
		delete nativeWindow;
		throw;
	}

	return WindowSurfacePair(nativeWindow, surface);
}